

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O3

void jinit_c_master_control(j_compress_ptr cinfo,boolean transcode_only)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  jpeg_error_mgr *pjVar4;
  bool bVar5;
  uint uVar6;
  jpeg_comp_master *pjVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  size_t __n;
  int *piVar11;
  boolean *pbVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint *puVar19;
  jpeg_scan_info *pjVar20;
  long lVar21;
  boolean component_sent [10];
  uint local_a68 [12];
  uint local_a38 [642];
  
  pjVar7 = (jpeg_comp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->master = pjVar7;
  pjVar7->prepare_for_pass = prepare_for_pass;
  pjVar7->pass_startup = pass_startup;
  pjVar7->finish_pass = finish_pass_master;
  pjVar7->is_last_pass = 0;
  uVar6 = cinfo->image_height;
  if ((((uVar6 == 0) || (cinfo->image_width == 0)) || (cinfo->num_components < 1)) ||
     (cinfo->input_components < 1)) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x20;
    (*pjVar4->error_exit)((j_common_ptr)cinfo);
    uVar6 = cinfo->image_height;
  }
  if ((0xffdc < uVar6) || (uVar6 = cinfo->image_width, 0xffdc < uVar6)) {
    *(undefined8 *)&cinfo->err->msg_code = 0xffdc00000029;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    uVar6 = cinfo->image_width;
  }
  if ((long)cinfo->input_components * (ulong)uVar6 >> 0x20 != 0) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x46;
    (*pjVar4->error_exit)((j_common_ptr)cinfo);
  }
  iVar16 = cinfo->data_precision;
  if (iVar16 != 8) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0xf;
    (pjVar4->msg_parm).i[0] = iVar16;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar16 = cinfo->num_components;
  if (10 < iVar16) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x1a;
    (pjVar4->msg_parm).i[0] = iVar16;
    (cinfo->err->msg_parm).i[1] = 10;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    iVar16 = cinfo->num_components;
  }
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  if (iVar16 < 1) {
    iVar9 = 1;
  }
  else {
    piVar11 = &cinfo->comp_info->v_samp_factor;
    iVar15 = 0;
    iVar9 = 1;
    iVar17 = 1;
    do {
      iVar10 = piVar11[-1];
      if ((iVar10 - 5U < 0xfffffffc) || (iVar18 = *piVar11, iVar18 - 5U < 0xfffffffc)) {
        pjVar4 = cinfo->err;
        pjVar4->msg_code = 0x12;
        (*pjVar4->error_exit)((j_common_ptr)cinfo);
        iVar16 = cinfo->num_components;
        iVar17 = cinfo->max_h_samp_factor;
        iVar10 = piVar11[-1];
        iVar18 = *piVar11;
        iVar9 = cinfo->max_v_samp_factor;
      }
      if (iVar10 < iVar17) {
        iVar10 = iVar17;
      }
      iVar17 = iVar10;
      cinfo->max_h_samp_factor = iVar17;
      if (iVar18 < iVar9) {
        iVar18 = iVar9;
      }
      iVar9 = iVar18;
      cinfo->max_v_samp_factor = iVar9;
      iVar15 = iVar15 + 1;
      piVar11 = piVar11 + 0x18;
    } while (iVar15 < iVar16);
    if (0 < iVar16) {
      pbVar12 = &cinfo->comp_info->component_needed;
      iVar16 = 0;
      do {
        pbVar12[-0xb] = iVar16;
        pbVar12[-3] = 8;
        lVar8 = jdiv_round_up((long)pbVar12[-10] * (ulong)cinfo->image_width,
                              (long)cinfo->max_h_samp_factor << 3);
        pbVar12[-5] = (JDIMENSION)lVar8;
        lVar8 = jdiv_round_up((long)pbVar12[-9] * (ulong)cinfo->image_height,
                              (long)cinfo->max_v_samp_factor << 3);
        pbVar12[-4] = (JDIMENSION)lVar8;
        lVar8 = jdiv_round_up((long)pbVar12[-10] * (ulong)cinfo->image_width,
                              (long)cinfo->max_h_samp_factor);
        pbVar12[-2] = (JDIMENSION)lVar8;
        lVar8 = jdiv_round_up((long)pbVar12[-9] * (ulong)cinfo->image_height,
                              (long)cinfo->max_v_samp_factor);
        pbVar12[-1] = (JDIMENSION)lVar8;
        *pbVar12 = 1;
        iVar16 = iVar16 + 1;
        pbVar12 = pbVar12 + 0x18;
      } while (iVar16 < cinfo->num_components);
      iVar9 = cinfo->max_v_samp_factor;
    }
  }
  lVar8 = jdiv_round_up((ulong)cinfo->image_height,(long)(iVar9 << 3));
  cinfo->total_iMCU_rows = (JDIMENSION)lVar8;
  pjVar20 = cinfo->scan_info;
  pbVar12 = &cinfo->num_scans;
  if (pjVar20 == (jpeg_scan_info *)0x0) {
    cinfo->progressive_mode = 0;
LAB_001189b5:
    *pbVar12 = 1;
  }
  else {
    if (*pbVar12 < 1) {
      *(undefined8 *)&cinfo->err->msg_code = 0x13;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      pjVar20 = cinfo->scan_info;
    }
    if ((pjVar20->Ss == 0) && (pjVar20->Se == 0x3f)) {
      cinfo->progressive_mode = 0;
      uVar13 = (ulong)cinfo->num_components;
      if ((long)uVar13 < 1) {
        iVar16 = 0;
      }
      else {
        __n = uVar13 << 2;
        puVar19 = local_a68;
        iVar16 = 0;
        iVar9 = 0;
LAB_0011860f:
        memset(puVar19,iVar9,__n);
      }
    }
    else {
      cinfo->progressive_mode = 1;
      uVar13 = (ulong)cinfo->num_components;
      iVar16 = 1;
      if (0 < (long)uVar13) {
        __n = uVar13 << 8;
        puVar19 = local_a38;
        iVar9 = 0xff;
        goto LAB_0011860f;
      }
    }
    if (0 < *pbVar12) {
      iVar16 = 1;
      do {
        uVar6 = pjVar20->comps_in_scan;
        uVar13 = (ulong)uVar6;
        if (uVar6 - 5 < 0xfffffffc) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x1a;
          (pjVar4->msg_parm).i[0] = uVar6;
          (cinfo->err->msg_parm).i[1] = 4;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          if (0 < (int)uVar6) goto LAB_00118670;
          bVar5 = false;
        }
        else {
LAB_00118670:
          uVar14 = 0;
          do {
            iVar9 = pjVar20->component_index[uVar14];
            if ((iVar9 < 0) || (cinfo->num_components <= iVar9)) {
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x13;
              (pjVar4->msg_parm).i[0] = iVar16;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            if ((uVar14 != 0) && (iVar9 <= pjVar20->component_index[uVar14 - 1])) {
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x13;
              (pjVar4->msg_parm).i[0] = iVar16;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
          bVar5 = true;
        }
        uVar1 = pjVar20->Ss;
        iVar9 = pjVar20->Se;
        uVar2 = pjVar20->Ah;
        uVar3 = pjVar20->Al;
        if (cinfo->progressive_mode == 0) {
          if ((((uVar1 != 0) || (iVar9 != 0x3f)) || (uVar2 != 0)) || (uVar3 != 0)) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x11;
            (pjVar4->msg_parm).i[0] = iVar16;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (bVar5) {
            uVar14 = 0;
            do {
              iVar9 = pjVar20->component_index[uVar14];
              if (local_a68[iVar9] != 0) {
                pjVar4 = cinfo->err;
                pjVar4->msg_code = 0x13;
                (pjVar4->msg_parm).i[0] = iVar16;
                (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              }
              local_a68[iVar9] = 1;
              uVar14 = uVar14 + 1;
            } while (uVar13 != uVar14);
          }
        }
        else {
          if ((0x3f < uVar1) || ((10 < uVar3 || 10 < uVar2) || (0x3f < iVar9 || iVar9 < (int)uVar1))
             ) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x11;
            (pjVar4->msg_parm).i[0] = iVar16;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (uVar1 == 0) {
            if (iVar9 != 0) goto LAB_00118759;
          }
          else if (uVar6 != 1) {
LAB_00118759:
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x11;
            (pjVar4->msg_parm).i[0] = iVar16;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (bVar5) {
            uVar14 = 0;
            do {
              lVar8 = (long)pjVar20->component_index[uVar14];
              if ((uVar1 != 0) && ((int)local_a38[lVar8 * 0x40] < 0)) {
                pjVar4 = cinfo->err;
                pjVar4->msg_code = 0x11;
                (pjVar4->msg_parm).i[0] = iVar16;
                (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              }
              if ((int)uVar1 <= iVar9) {
                lVar21 = 0;
                do {
                  if ((int)local_a38[(long)(int)uVar1 + lVar8 * 0x40 + lVar21] < 0) {
                    if (uVar2 != 0) goto LAB_00118826;
                  }
                  else if (local_a38[(long)(int)uVar1 + lVar8 * 0x40 + lVar21] != uVar2 ||
                           uVar2 - 1 != uVar3) {
LAB_00118826:
                    pjVar4 = cinfo->err;
                    pjVar4->msg_code = 0x11;
                    (pjVar4->msg_parm).i[0] = iVar16;
                    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
                  }
                  local_a38[(long)(int)uVar1 + lVar8 * 0x40 + lVar21] = uVar3;
                  lVar21 = lVar21 + 1;
                } while ((iVar9 - uVar1) + 1 != (int)lVar21);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar13);
          }
        }
        pjVar20 = pjVar20 + 1;
        bVar5 = iVar16 < *pbVar12;
        iVar16 = iVar16 + 1;
      } while (bVar5);
      uVar13 = (ulong)(uint)cinfo->num_components;
      iVar16 = cinfo->progressive_mode;
    }
    if (iVar16 == 0) {
      if (0 < (int)uVar13) {
        lVar8 = 0;
        do {
          if (local_a68[lVar8] == 0) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x2d;
            (*pjVar4->error_exit)((j_common_ptr)cinfo);
            uVar13 = (ulong)(uint)cinfo->num_components;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)uVar13);
      }
    }
    else if (0 < (int)uVar13) {
      puVar19 = local_a38;
      lVar8 = 0;
      do {
        if ((int)*puVar19 < 0) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0x2d;
          (*pjVar4->error_exit)((j_common_ptr)cinfo);
          uVar13 = (ulong)(uint)cinfo->num_components;
        }
        lVar8 = lVar8 + 1;
        puVar19 = puVar19 + 0x40;
      } while (lVar8 < (int)uVar13);
    }
    if ((cinfo->progressive_mode != 0) && (cinfo->arith_code == 0)) {
      pbVar12 = &cinfo->optimize_coding;
      goto LAB_001189b5;
    }
  }
  if (transcode_only == 0) {
    *(undefined4 *)&pjVar7[1].prepare_for_pass = 0;
    iVar16 = cinfo->optimize_coding;
    *(undefined4 *)((long)&pjVar7[1].pass_startup + 4) = 0;
    *(undefined4 *)((long)&pjVar7[1].prepare_for_pass + 4) = 0;
    if (iVar16 == 0) goto LAB_00118a14;
  }
  else {
    if (cinfo->optimize_coding == 0) {
      pjVar7[1].prepare_for_pass = (_func_void_j_compress_ptr *)0x2;
      *(undefined4 *)((long)&pjVar7[1].pass_startup + 4) = 0;
LAB_00118a14:
      iVar16 = cinfo->num_scans;
      goto LAB_00118a1c;
    }
    pjVar7[1].prepare_for_pass = (_func_void_j_compress_ptr *)0x1;
    *(undefined4 *)((long)&pjVar7[1].pass_startup + 4) = 0;
  }
  iVar16 = cinfo->num_scans * 2;
LAB_00118a1c:
  *(int *)&pjVar7[1].pass_startup = iVar16;
  pjVar7[1].finish_pass =
       (_func_void_j_compress_ptr *)"libjpeg-turbo version 2.1.1 (build 20250502)";
  return;
}

Assistant:

GLOBAL(void)
jinit_c_master_control(j_compress_ptr cinfo, boolean transcode_only)
{
  my_master_ptr master;

  master = (my_master_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_comp_master));
  cinfo->master = (struct jpeg_comp_master *)master;
  master->pub.prepare_for_pass = prepare_for_pass;
  master->pub.pass_startup = pass_startup;
  master->pub.finish_pass = finish_pass_master;
  master->pub.is_last_pass = FALSE;

  /* Validate parameters, determine derived values */
  initial_setup(cinfo, transcode_only);

  if (cinfo->scan_info != NULL) {
#ifdef C_MULTISCAN_FILES_SUPPORTED
    validate_script(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    cinfo->num_scans = 1;
  }

  if (cinfo->progressive_mode && !cinfo->arith_code)  /*  TEMPORARY HACK ??? */
    cinfo->optimize_coding = TRUE; /* assume default tables no good for progressive mode */

  /* Initialize my private state */
  if (transcode_only) {
    /* no main pass in transcoding */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    else
      master->pass_type = output_pass;
  } else {
    /* for normal compression, first pass is always this type: */
    master->pass_type = main_pass;
  }
  master->scan_number = 0;
  master->pass_number = 0;
  if (cinfo->optimize_coding)
    master->total_passes = cinfo->num_scans * 2;
  else
    master->total_passes = cinfo->num_scans;

  master->jpeg_version = PACKAGE_NAME " version " VERSION " (build " BUILD ")";
}